

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

void Llb_Nonlin4Print(Llb_Mgr_t_conflict *p)

{
  Llb_Var_t *pLVar1;
  Vec_Int_t *pVVar2;
  Llb_Prt_t *pLVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  putchar(10);
  for (uVar5 = 0; (long)uVar5 < (long)p->nVars; uVar5 = uVar5 + 1) {
    pLVar1 = p->pVars[uVar5];
    if (pLVar1 != (Llb_Var_t *)0x0) {
      iVar6 = 0;
      printf("Var %3d : ",uVar5 & 0xffffffff);
      while( true ) {
        pVVar2 = pLVar1->vParts;
        if (pVVar2->nSize <= iVar6) break;
        iVar4 = Vec_IntEntry(pVVar2,iVar6);
        printf("%d ",(ulong)(uint)p->pParts[iVar4]->iPart);
        iVar6 = iVar6 + 1;
      }
      putchar(10);
    }
  }
  for (uVar5 = 0; (long)uVar5 < (long)p->iPartFree; uVar5 = uVar5 + 1) {
    pLVar3 = p->pParts[uVar5];
    if (pLVar3 != (Llb_Prt_t *)0x0) {
      iVar6 = 0;
      printf("Part %3d : ",uVar5 & 0xffffffff);
      while( true ) {
        pVVar2 = pLVar3->vVars;
        if (pVVar2->nSize <= iVar6) break;
        iVar4 = Vec_IntEntry(pVVar2,iVar6);
        printf("%d ",(ulong)(uint)p->pVars[iVar4]->iVar);
        iVar6 = iVar6 + 1;
      }
      putchar(10);
    }
  }
  return;
}

Assistant:

void Llb_Nonlin4Print( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k;
    printf( "\n" );
    Llb_MgrForEachVar( p, pVar, i )
    {
        printf( "Var %3d : ", i );
        Llb_VarForEachPart( p, pVar, pPart, k )
            printf( "%d ", pPart->iPart );
        printf( "\n" );
    }
    Llb_MgrForEachPart( p, pPart, i )
    {
        printf( "Part %3d : ", i );
        Llb_PartForEachVar( p, pPart, pVar, k )
            printf( "%d ", pVar->iVar );
        printf( "\n" );
    }
}